

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xboxskin.cpp
# Opt level: O0

Stream * rw::xbox::readNativeSkin(Stream *stream,int32 param_2,void *object,int32 offset)

{
  FILE *pFVar1;
  bool bVar2;
  uint uVar3;
  int32 iVar4;
  char *pcVar5;
  Skin *this;
  void *data;
  void *pvVar6;
  int32 size;
  NativeSkin *natskin;
  int32 numBones;
  Skin *skin;
  Error _e_2;
  Error _e_1;
  Error _e;
  uint32 platform;
  uint32 vers;
  Geometry *geometry;
  int32 offset_local;
  void *object_local;
  int32 param_1_local;
  Stream *stream_local;
  
  bVar2 = findChunk(stream,1,(uint32 *)0x0,&_e.code);
  if (bVar2) {
    _e.plugin = Stream::readU32(stream);
    if (_e.plugin == 5) {
      if (_e.code < 0x35000) {
        skin._0_4_ = 0x116;
        skin._4_4_ = 0x80000005;
        fprintf(_stderr,"%s:%d: ",
                "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/xboxskin.cpp"
                ,0x2e);
        pFVar1 = _stderr;
        pcVar5 = dbgsprint(0x80000005,(ulong)_e.code);
        fprintf(pFVar1,"%s\n",pcVar5);
        setError((Error *)&skin);
        stream_local = (Stream *)0x0;
      }
      else {
        this = (Skin *)mustmalloc_LOC(0x70,0x30116,
                                      "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/xboxskin.cpp line: 50"
                                     );
        *(Skin **)((long)object + (long)offset) = this;
        uVar3 = Stream::readI32(stream);
        Skin::init(this,(EVP_PKEY_CTX *)(ulong)uVar3);
        data = mustmalloc_LOC(0x818,0x30116,
                              "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/xboxskin.cpp line: 55"
                             );
        this->platformData = data;
        Stream::read32(stream,data,0x400);
        Stream::read32(stream,(void *)((long)data + 0x400),0x400);
        iVar4 = Stream::readI32(stream);
        *(int32 *)((long)data + 0x800) = iVar4;
        iVar4 = Stream::readI32(stream);
        this->numWeights = iVar4;
        (*stream->_vptr_Stream[5])(stream,4,1);
        iVar4 = Stream::readI32(stream);
        *(int32 *)((long)data + 0x810) = iVar4;
        uVar3 = *(int *)((long)object + 0x1c) * *(int *)((long)data + 0x810);
        pvVar6 = mustmalloc_LOC((long)(int)uVar3,0x30116,
                                "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/xboxskin.cpp line: 64"
                               );
        *(void **)((long)data + 0x808) = pvVar6;
        (*stream->_vptr_Stream[4])(stream,*(undefined8 *)((long)data + 0x808),(ulong)uVar3);
        Stream::read32(stream,this->inverseMatrices,this->numBones << 6);
        readSkinSplitData(stream,this);
        stream_local = stream;
      }
    }
    else {
      _e_2.plugin = 0x116;
      _e_2.code = 0x80000006;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/xboxskin.cpp",
              0x2a);
      pFVar1 = _stderr;
      pcVar5 = dbgsprint(0x80000006,(ulong)_e.plugin);
      fprintf(pFVar1,"%s\n",pcVar5);
      setError(&_e_2);
      stream_local = (Stream *)0x0;
    }
  }
  else {
    _e_1.plugin = 0x116;
    _e_1.code = 0x80000004;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/xboxskin.cpp",
            0x25);
    pFVar1 = _stderr;
    pcVar5 = dbgsprint(0x80000004,"STRUCT");
    fprintf(pFVar1,"%s\n",pcVar5);
    setError(&_e_1);
    stream_local = (Stream *)0x0;
  }
  return stream_local;
}

Assistant:

Stream*
readNativeSkin(Stream *stream, int32, void *object, int32 offset)
{
	ASSERTLITTLE;
	Geometry *geometry = (Geometry*)object;
	uint32 vers, platform;
	if(!findChunk(stream, ID_STRUCT, nil, &vers)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	platform = stream->readU32();
	if(platform != PLATFORM_XBOX){
		RWERROR((ERR_PLATFORM, platform));
		return nil;
	}
	if(vers < 0x35000){
		RWERROR((ERR_VERSION, vers));
		return nil;
	}

	Skin *skin = rwNewT(Skin, 1, MEMDUR_EVENT | ID_SKIN);
	*PLUGINOFFSET(Skin*, geometry, offset) = skin;

	int32 numBones = stream->readI32();
	skin->init(numBones, 0, 0);
	NativeSkin *natskin = rwNewT(NativeSkin, 1, MEMDUR_EVENT | ID_SKIN);
	skin->platformData = natskin;
	stream->read32(natskin->table1, 256*sizeof(int32));
	stream->read32(natskin->table2, 256*sizeof(int32));
	natskin->numUsedBones = stream->readI32();
	skin->numWeights = stream->readI32();
	stream->seek(4);	// skip pointer to vertexBuffer
	natskin->stride = stream->readI32();
	int32 size = geometry->numVertices*natskin->stride;
	natskin->vertexBuffer = rwNewT(uint8, size, MEMDUR_EVENT | ID_SKIN);
	stream->read8(natskin->vertexBuffer, size);
	stream->read32(skin->inverseMatrices, skin->numBones*64);

	readSkinSplitData(stream, skin);
	return stream;
}